

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

void base64_encode(char *src,size_t srclen,char *out,size_t *outlen,int flags)

{
  size_t t;
  size_t s;
  base64_state state;
  size_t local_50;
  size_t local_48;
  base64_state local_40;
  
  base64_stream_encode_init(&local_40,flags);
  (*codec.enc)(&local_40,src,srclen,out,&local_48);
  base64_stream_encode_final(&local_40,out + local_48,&local_50);
  *outlen = local_50 + local_48;
  return;
}

Assistant:

void
base64_encode
	( const char	*src
	, size_t	 srclen
	, char		*out
	, size_t	*outlen
	, int		 flags
	)
{
	size_t s;
	size_t t;
	struct base64_state state;

	#ifdef _OPENMP
	if (srclen >= OMP_THRESHOLD) {
		base64_encode_openmp(src, srclen, out, outlen, flags);
		return;
	}
	#endif

	// Init the stream reader:
	base64_stream_encode_init(&state, flags);

	// Feed the whole string to the stream reader:
	base64_stream_encode(&state, src, srclen, out, &s);

	// Finalize the stream by writing trailer if any:
	base64_stream_encode_final(&state, out + s, &t);

	// Final output length is stream length plus tail:
	*outlen = s + t;
}